

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred.c
# Opt level: O1

void ipred_bi_uv(pel *src,pel *dst,int i_dst,int w,int h,int bit_depth)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  byte bVar11;
  pel pVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  byte *pbVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  int iVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  int iVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  int ref_le [128];
  int wy [128];
  int le [128];
  int up [128];
  ulong local_a80;
  uint auStack_a38 [128];
  uint auStack_838 [128];
  int aiStack_638 [128];
  int aiStack_438 [128];
  int aiStack_238 [130];
  
  bVar1 = g_tbl_log2[w];
  bVar2 = g_tbl_log2[h];
  iVar14 = (int)(char)bVar1 - (int)(char)bVar2;
  bVar11 = bVar2;
  if ((int)(char)bVar1 < (int)(char)bVar2) {
    bVar11 = bVar1;
  }
  iVar20 = 1 << (bVar2 + bVar1 & 0x1f);
  uVar8 = w * 2;
  uVar22 = h * 2;
  iVar15 = -iVar14;
  if ((char)bVar2 < (char)bVar1) {
    iVar15 = iVar14;
  }
  if (0 < (int)uVar8) {
    uVar13 = 0;
    do {
      auStack_a38[uVar13] = (uint)src[uVar13 + 2];
      uVar13 = uVar13 + 1;
    } while (uVar8 != uVar13);
  }
  if (0 < (int)uVar22) {
    pbVar16 = src + -1;
    uVar13 = 0;
    do {
      auStack_838[uVar13] = (uint)pbVar16[-1];
      auStack_838[uVar13 + 1] = (uint)*pbVar16;
      uVar13 = uVar13 + 2;
      pbVar16 = pbVar16 + -2;
    } while (uVar13 < uVar22);
  }
  lVar9 = (long)(int)uVar8;
  uVar23 = (uint)src[lVar9];
  uVar25 = (uint)src[-(long)(int)uVar22];
  if (w == h) {
    uVar21 = (uint)src[-(long)(int)uVar22] + (uint)src[lVar9] + 1 >> 1 & 0xff;
  }
  else {
    uVar21 = (int)((1 << (bVar11 + 5 & 0x1f)) +
                  ((uVar25 << (bVar2 & 0x1f)) + (uVar23 << (bVar1 & 0x1f))) *
                  *(int *)(&DAT_0017ea60 + (long)iVar15 * 4)) >> (bVar11 + 6 & 0x1f);
  }
  uVar26 = (uint)src[lVar9 + 1];
  uVar19 = (uint)src[h * -2 + 1];
  if (w == h) {
    uVar27 = (uint)src[h * -2 + 1] + (uint)src[lVar9 + 1] + 1 >> 1 & 0xff;
  }
  else {
    uVar27 = (int)((1 << (bVar11 + 5 & 0x1f)) +
                  ((uVar19 << (bVar2 & 0x1f)) + (uVar26 << (bVar1 & 0x1f))) *
                  *(int *)(&DAT_0017ea60 + (long)iVar15 * 4)) >> (bVar11 + 6 & 0x1f);
  }
  if (0 < (int)uVar8) {
    uVar13 = 0;
    do {
      uVar3 = auStack_a38[uVar13];
      uVar4 = auStack_a38[uVar13 + 1];
      aiStack_238[uVar13] = uVar25 - uVar3;
      aiStack_238[uVar13 + 1] = uVar19 - uVar4;
      auStack_a38[uVar13] = uVar3 << (bVar2 & 0x1f);
      auStack_a38[uVar13 + 1] = uVar4 << (bVar2 & 0x1f);
      uVar13 = uVar13 + 2;
    } while (uVar13 < uVar8);
  }
  if (0 < (int)uVar22) {
    iVar14 = 0;
    iVar15 = 0;
    uVar13 = 0;
    do {
      uVar3 = auStack_838[uVar13];
      uVar4 = auStack_838[uVar13 + 1];
      aiStack_438[uVar13] = uVar23 - uVar3;
      aiStack_438[uVar13 + 1] = uVar26 - uVar4;
      auStack_838[uVar13] = uVar3 << (bVar1 & 0x1f);
      auStack_838[uVar13 + 1] = uVar4 << (bVar1 & 0x1f);
      aiStack_638[uVar13] = iVar15;
      aiStack_638[uVar13 + 1] = iVar14;
      uVar13 = uVar13 + 2;
      iVar15 = iVar15 + (uVar21 * 2 - (uVar25 + uVar23));
      iVar14 = iVar14 + (uVar27 * 2 - (uVar19 + uVar26));
    } while (uVar13 < uVar22);
  }
  if (0 < h) {
    bVar11 = bVar2 + bVar1 + 1;
    uVar22 = ~(-1 << ((byte)bit_depth & 0x1f));
    local_a80 = 0;
    do {
      if (0 < (int)uVar8) {
        lVar10 = (long)(local_a80 << 0x21) >> 0x1e;
        iVar17 = (int)local_a80 * 2;
        iVar14 = aiStack_438[iVar17];
        iVar15 = *(int *)((long)aiStack_438 + lVar10 + 4);
        iVar5 = aiStack_638[iVar17];
        iVar6 = *(int *)((long)aiStack_638 + lVar10 + 4);
        iVar18 = *(int *)((long)auStack_838 + lVar10 + 4);
        uVar25 = auStack_838[iVar17];
        lVar10 = 0;
        iVar17 = iVar20;
        iVar24 = iVar20;
        do {
          iVar18 = iVar18 + iVar15;
          uVar25 = uVar25 + iVar14;
          uVar23 = auStack_a38[lVar10];
          uVar21 = auStack_a38[lVar10 + 1];
          iVar7 = aiStack_238[lVar10];
          auStack_a38[lVar10] = uVar23 + iVar7;
          auStack_a38[lVar10 + 1] = uVar21 + aiStack_238[lVar10 + 1];
          uVar19 = (int)((uVar25 << (bVar2 & 0x1f)) + iVar24 + (uVar23 + iVar7 << (bVar1 & 0x1f)))
                   >> (bVar11 & 0x1f);
          uVar21 = (int)((iVar18 << (bVar2 & 0x1f)) + iVar17 +
                        (uVar21 + aiStack_238[lVar10 + 1] << (bVar1 & 0x1f))) >> (bVar11 & 0x1f);
          uVar23 = uVar19;
          if ((int)uVar22 <= (int)uVar19) {
            uVar23 = uVar22;
          }
          pVar12 = (pel)uVar23;
          if ((int)uVar19 < 0) {
            pVar12 = '\0';
          }
          dst[lVar10] = pVar12;
          uVar23 = uVar21;
          if ((int)uVar22 <= (int)uVar21) {
            uVar23 = uVar22;
          }
          pVar12 = (pel)uVar23;
          if ((int)uVar21 < 0) {
            pVar12 = '\0';
          }
          dst[lVar10 + 1] = pVar12;
          lVar10 = lVar10 + 2;
          iVar17 = iVar17 + iVar6;
          iVar24 = iVar24 + iVar5;
        } while (lVar10 < lVar9);
      }
      dst = dst + i_dst;
      local_a80 = local_a80 + 1;
    } while (local_a80 != (uint)h);
  }
  return;
}

Assistant:

void ipred_bi_uv(pel *src, pel *dst, int i_dst, int w, int h, int bit_depth)
{
    uavs3d_assert(g_tbl_log2[w] >= 2);
    uavs3d_assert(g_tbl_log2[h] >= 2);

    int x, y;
    int ishift_x = g_tbl_log2[w];
    int ishift_y = g_tbl_log2[h];
    int ishift = COM_MIN(ishift_x, ishift_y);
    int ishift_xy = ishift_x + ishift_y + 1;
    int offset = 1 << (ishift_x + ishift_y);
    int a_u, b_u, c_u, wt_u, tmp_u;
    int a_v, b_v, c_v, wt_v, tmp_v;
    int ref_up[MAX_CU_SIZE], ref_le[MAX_CU_SIZE], up[MAX_CU_SIZE], le[MAX_CU_SIZE], wy[MAX_CU_SIZE];
    int wc, tbl_wc[6] = { -1, 21, 13, 7, 4, 2 };
    int w2 = w << 1;
    int h2 = h << 1;
    int max_pel = (1 << bit_depth) - 1;
    int val_u, val_v;

    wc = ishift_x > ishift_y ? ishift_x - ishift_y : ishift_y - ishift_x;
    uavs3d_assert(wc <= 5);

    wc = tbl_wc[wc];
    for (x = 0; x < w2; x++) {
        ref_up[x] = src[x + 2];  
    }
    for (y = 0; y < h2; y += 2) {
        ref_le[y    ] = src[-y - 2];
        ref_le[y + 1] = src[-y - 1];
    }

    a_u = src[w2];
    b_u = src[-h2];
    c_u = (w == h) ? (a_u + b_u + 1) >> 1 : (((a_u << ishift_x) + (b_u << ishift_y)) * wc + (1 << (ishift + 5))) >> (ishift + 6);
    wt_u = (c_u << 1) - a_u - b_u;

    a_v = src[w2 + 1];
    b_v = src[-h2 + 1];
    c_v = (w == h) ? (a_v + b_v + 1) >> 1 : (((a_v << ishift_x) + (b_v << ishift_y)) * wc + (1 << (ishift + 5))) >> (ishift + 6);
    wt_v = (c_v << 1) - a_v - b_v;

    for (x = 0; x < w2; x += 2) {
        up[x    ] = b_u - ref_up[x];
        up[x + 1] = b_v - ref_up[x + 1];
        ref_up[x    ] <<= ishift_y;
        ref_up[x + 1] <<= ishift_y;
    }
    tmp_u = tmp_v = 0;
    for (y = 0; y < h2; y += 2) {
        le[y    ] = a_u - ref_le[y];
        le[y + 1] = a_v - ref_le[y + 1];
        ref_le[y    ] <<= ishift_x;
        ref_le[y + 1] <<= ishift_x;
        wy[y    ] = tmp_u;
        wy[y + 1] = tmp_v;
        tmp_u += wt_u;
        tmp_v += wt_v;
    }
    for (y = 0; y < h; y++) {
        int y2 = y << 1;
        int predx_u = ref_le[y2    ];
        int predx_v = ref_le[y2 + 1];
        int wxy_u = 0;
        int wxy_v = 0;
        for (x = 0; x < w2; x += 2) {
            predx_u += le[y2];
            predx_v += le[y2 + 1];
            ref_up[x    ] += up[x];
            ref_up[x + 1] += up[x + 1];
            val_u = ((predx_u << ishift_y) + (ref_up[x    ] << ishift_x) + wxy_u + offset) >> ishift_xy;
            val_v = ((predx_v << ishift_y) + (ref_up[x + 1] << ishift_x) + wxy_v + offset) >> ishift_xy;
            dst[x    ] = COM_CLIP3(0, max_pel, val_u);
            dst[x + 1] = COM_CLIP3(0, max_pel, val_v);
            wxy_u += wy[y2];
            wxy_v += wy[y2 + 1];
        }
        dst += i_dst;
    }
}